

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O3

void __thiscall
llvm::sys::fs::directory_iterator::directory_iterator
          (directory_iterator *this,directory_entry *de,error_code *ec,bool follow_symlinks)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_01;
  undefined1 in_R8B;
  StringRef path;
  error_code eVar2;
  
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->FollowSymlinks = follow_symlinks;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)0x1e0000;
  this_01 = (element_type *)(p_Var1 + 1);
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var1[1]._M_use_count = &p_Var1[2]._M_use_count;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  *(undefined8 *)&p_Var1[5]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var1[6]._vptr__Sp_counted_base + 4) = 0;
  p_Var1[6]._M_weak_count = 0xffff;
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_01;
  this_00 = (this->State).
            super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    this_01 = (this->State).
              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  }
  path.Length._0_1_ = this->FollowSymlinks;
  path.Data = (char *)(de->Path)._M_string_length;
  path.Length._1_7_ = 0;
  eVar2 = detail::directory_iterator_construct
                    ((detail *)this_01,(DirIterState *)(de->Path)._M_dataplus._M_p,path,(bool)in_R8B
                    );
  ec->_M_value = eVar2._M_value;
  ec->_M_cat = eVar2._M_cat;
  update_error_code_for_current_entry(this,ec);
  return;
}

Assistant:

explicit directory_iterator(const directory_entry &de, std::error_code &ec,
                              bool follow_symlinks = true)
      : FollowSymlinks(follow_symlinks) {
    State = std::make_shared<detail::DirIterState>();
    ec = detail::directory_iterator_construct(
        *State, de.path(), FollowSymlinks);
    update_error_code_for_current_entry(ec);
  }